

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame_enc.c
# Opt level: O0

int PreLoopInitialize(VP8Encoder *enc)

{
  uint uVar1;
  int iVar2;
  long in_RDI;
  int bytes_per_parts;
  int average_bytes_per_MB;
  int ok;
  int p;
  undefined7 in_stack_ffffffffffffffd8;
  bool bVar3;
  int local_18;
  int local_14;
  int local_4;
  
  local_18 = 1;
  uVar1 = (uint)"2\x18\x10\t\a\x05\x03\x02"[*(int *)(in_RDI + 0xe00) >> 4];
  iVar2 = (int)(*(int *)(in_RDI + 0x30) * *(int *)(in_RDI + 0x34) * uVar1) / *(int *)(in_RDI + 0x3c)
  ;
  local_14 = 0;
  while( true ) {
    bVar3 = false;
    if (local_18 != 0) {
      bVar3 = local_14 < *(int *)(in_RDI + 0x3c);
    }
    if (bVar3 == false) break;
    local_18 = VP8BitWriterInit((VP8BitWriter *)CONCAT44(uVar1,iVar2),
                                CONCAT17(bVar3,in_stack_ffffffffffffffd8));
    local_14 = local_14 + 1;
  }
  if (local_18 == 0) {
    VP8EncFreeBitWriters((VP8Encoder *)CONCAT44(uVar1,iVar2));
    local_4 = WebPEncodingSetError(*(WebPPicture **)(in_RDI + 8),VP8_ENC_ERROR_OUT_OF_MEMORY);
  }
  else {
    local_4 = local_18;
  }
  return local_4;
}

Assistant:

static int PreLoopInitialize(VP8Encoder* const enc) {
  int p;
  int ok = 1;
  const int average_bytes_per_MB = kAverageBytesPerMB[enc->base_quant >> 4];
  const int bytes_per_parts =
      enc->mb_w * enc->mb_h * average_bytes_per_MB / enc->num_parts;
  // Initialize the bit-writers
  for (p = 0; ok && p < enc->num_parts; ++p) {
    ok = VP8BitWriterInit(enc->parts + p, bytes_per_parts);
  }
  if (!ok) {
    VP8EncFreeBitWriters(enc);  // malloc error occurred
    return WebPEncodingSetError(enc->pic, VP8_ENC_ERROR_OUT_OF_MEMORY);
  }
  return ok;
}